

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall Lowerer::LowerSpreadArrayLiteral(Lowerer *this,Instr *instr)

{
  Opnd *pOVar1;
  LowererMD *this_00;
  
  LoadScriptContext(this,instr);
  pOVar1 = IR::Instr::UnlinkSrc2(instr);
  this_00 = &this->m_lowererMD;
  LowererMD::LoadHelperArgument(this_00,instr,pOVar1);
  pOVar1 = IR::Instr::UnlinkSrc1(instr);
  LowererMD::LoadHelperArgument(this_00,instr,pOVar1);
  LowererMD::ChangeToHelperCall
            (this_00,instr,HelperSpreadArrayLiteral,(LabelInstr *)0x0,(Opnd *)0x0,
             (PropertySymOpnd *)0x0,false);
  return;
}

Assistant:

void
Lowerer::LowerSpreadArrayLiteral(IR::Instr *instr)
{
    LoadScriptContext(instr);

    IR::Opnd *src2Opnd = instr->UnlinkSrc2();
    m_lowererMD.LoadHelperArgument(instr, src2Opnd);

    IR::Opnd *src1Opnd = instr->UnlinkSrc1();
    m_lowererMD.LoadHelperArgument(instr, src1Opnd);

    this->m_lowererMD.ChangeToHelperCall(instr, IR::HelperSpreadArrayLiteral);
}